

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.h
# Opt level: O2

hash_type __thiscall libchess::Position::calculate_pawn_hash(Position *this)

{
  Color color;
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = 0;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
    color.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)((MetaValueType<int> *)((long)&constants::COLORS + lVar4))->value_;
    for (uVar3 = this->piece_type_bb_[0].value_ &
                 this->color_bb_[(int)color.super_MetaValueType<int>.value_].value_; uVar3 != 0;
        uVar3 = uVar3 & uVar3 - 1) {
      lVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar2 = zobrist::piece_square_key((MetaValueType<int>)(value_type)lVar1,(PieceType)0x0,color);
      uVar5 = uVar5 ^ uVar2;
    }
  }
  return uVar5;
}

Assistant:

hash_type calculate_pawn_hash() const {
        hash_type hash_value = 0;
        for (Color c : constants::COLORS) {
            Bitboard bb = piece_type_bb(constants::PAWN, c);
            while (bb) {
                hash_value ^= zobrist::piece_square_key(bb.forward_bitscan(), constants::PAWN, c);
                bb.forward_popbit();
            }
        }
        return hash_value;
    }